

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O2

string * __thiscall
protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::SerializeAsString_abi_cxx11_
          (string *__return_storage_ptr__,
          HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> vec;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  SerializeAsArray((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_28._M_impl.super__Vector_impl_data._M_start,
             local_28._M_impl.super__Vector_impl_data._M_finish);
  perfetto::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string SerializeAsString() {
    auto vec = SerializeAsArray();
    return std::string(reinterpret_cast<const char*>(vec.data()), vec.size());
  }